

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_archiver.cpp
# Opt level: O0

void __thiscall HuffmanArchiver::HuffmanArchiver(HuffmanArchiver *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  std::
  unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>
  ::unordered_map((unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>
                   *)0x12ad33);
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  return;
}

Assistant:

HuffmanArchiver::HuffmanArchiver() {
    num_of_symbols_in = 0;
    num_of_symbols_out = 0;
    used_additional_bytes = 0;
}